

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::BlindRawTransaction
          (JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::BlindTransactionResponseStruct_(const_cfd::js::api::BlindRawTransactionRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::BlindTransactionResponseStruct(cfd::js::api::BlindRawTransactionRequestStruct_const&)>
  ::
  function<cfd::js::api::BlindTransactionResponseStruct(&)(cfd::js::api::BlindRawTransactionRequestStruct_const&),void>
            ((function<cfd::js::api::BlindTransactionResponseStruct(cfd::js::api::BlindRawTransactionRequestStruct_const&)>
              *)&local_38,ElementsTransactionStructApi::BlindTransaction);
  ExecuteJsonApi<cfd::js::api::json::BlindRawTransactionRequest,cfd::js::api::json::BlindTransactionResponse,cfd::js::api::BlindRawTransactionRequestStruct,cfd::js::api::BlindTransactionResponseStruct>
            ((json *)this,request_message,&local_38);
  std::
  function<cfd::js::api::BlindTransactionResponseStruct_(const_cfd::js::api::BlindRawTransactionRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::BlindRawTransaction(
    const std::string &request_message) {
  return ExecuteJsonApi<
      api::json::BlindRawTransactionRequest,
      api::json::BlindTransactionResponse,
      api::BlindRawTransactionRequestStruct,
      api::BlindTransactionResponseStruct>(
      request_message,
      ElementsTransactionStructApi::BlindTransaction);  // NOLINT
}